

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O0

istream * operator>>(istream *i,Employee *e)

{
  Employee *pEVar1;
  ostream *this;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  undefined1 local_1f8 [8];
  Person p;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  Address a;
  string id1;
  string name1;
  int workDone1;
  int workToDo1;
  int salaryPerHour1;
  int hourWork1;
  Employee *e_local;
  istream *i_local;
  
  _salaryPerHour1 = e;
  e_local = (Employee *)i;
  std::__cxx11::string::string((string *)(id1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(a.street.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_148,"",(allocator *)(p.address.street.field_2._M_local_buf + 0xf));
  Address::Address((Address *)local_c8,&local_e8,&local_120,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)(p.address.street.field_2._M_local_buf + 0xf))
  ;
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"",&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"92*sa11178",&local_241);
  Person::Person((Person *)local_1f8,&local_218,&local_240,(Address *)local_c8);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::operator<<((ostream *)&std::cout,"Enter name: ");
  std::operator>>((istream *)e_local,(string *)(id1.field_2._M_local_buf + 8));
  std::operator<<((ostream *)&std::cout,"Enter id: ");
  std::operator>>((istream *)e_local,(string *)(a.street.field_2._M_local_buf + 8));
  this = std::operator<<((ostream *)&std::cout,"Enter address: ");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  operator>>((istream *)e_local,(Address *)local_c8);
  Person::setName((Person *)local_1f8,(string *)((long)&id1.field_2 + 8));
  Person::setId((Person *)local_1f8,(string *)((long)&a.street.field_2 + 8));
  Person::setAddress((Person *)local_1f8,(Address *)local_c8);
  std::operator<<((ostream *)&std::cout,"Enter hour work: ");
  std::istream::operator>>(e_local,&workToDo1);
  std::operator<<((ostream *)&std::cout,"Enter salary per hour: ");
  std::istream::operator>>(e_local,&workDone1);
  std::operator<<((ostream *)&std::cout,"Enter work to do: ");
  std::istream::operator>>(e_local,(int *)(name1.field_2._M_local_buf + 0xc));
  std::operator<<((ostream *)&std::cout,"Enter work done: ");
  std::istream::operator>>(e_local,(int *)(name1.field_2._M_local_buf + 8));
  Employee::setSalaryPerHour(_salaryPerHour1,workDone1);
  Employee::setHourWork(_salaryPerHour1,workToDo1);
  Employee::setWorkDone(_salaryPerHour1,name1.field_2._8_4_);
  Employee::setWorkToDo(_salaryPerHour1,name1.field_2._12_4_);
  pEVar1 = e_local;
  Person::~Person((Person *)local_1f8);
  Address::~Address((Address *)local_c8);
  std::__cxx11::string::~string((string *)(a.street.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(id1.field_2._M_local_buf + 8));
  return (istream *)pEVar1;
}

Assistant:

std::istream &operator>>(istream &i, Employee &e) {

    int hourWork1, salaryPerHour1, workToDo1, workDone1;
    string name1, id1;
    Address a("", "", "");
    Person p("", "92*sa11178", a);
    cout << "Enter name: ";
    i >> name1;
    cout << "Enter id: ";
    i >> id1;
    cout << "Enter address: " << endl;
    i >> a;
    p.setName(name1);
    p.setId(id1);
    p.setAddress(a);
    cout << "Enter hour work: ";
    i >> hourWork1;
    cout << "Enter salary per hour: ";
    i >> salaryPerHour1;
    cout << "Enter work to do: ";
    i >> workToDo1;
    cout << "Enter work done: ";
    i >> workDone1;
    e.setSalaryPerHour(salaryPerHour1);
    e.setHourWork(hourWork1);
    e.setWorkDone(workDone1);
    e.setWorkToDo(workToDo1);
    return i;
}